

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

UString * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::manifestJson
          (UString *__return_storage_ptr__,Interpreter *this,LocationRange *loc,bool multiline,
          UString *indent)

{
  Value *pVVar1;
  uint *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Type TVar4;
  HeapEntity *pHVar5;
  key_type *__k;
  pointer pcVar6;
  pointer pcVar7;
  pointer pFVar8;
  anon_union_8_3_4e909c26_for_v aVar9;
  undefined4 uVar10;
  mapped_type *ppIVar11;
  _Rb_tree_node_base *p_Var12;
  AST *ast_;
  undefined8 uVar13;
  UString *extraout_RAX;
  UString *extraout_RAX_00;
  UString *pUVar14;
  RuntimeError *__return_storage_ptr___00;
  uint uVar15;
  LocationRange *pLVar16;
  undefined1 *puVar17;
  char32_t *pcVar18;
  _Alloc_hider _Var19;
  _func_int **pp_Var20;
  Interpreter *pIVar21;
  UString element;
  UStringStream ss;
  UString indent2;
  LocationRange tloc;
  undefined1 local_148 [32];
  _Rb_tree_node_base *local_128;
  size_t local_120;
  LocationRange *local_110;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_108;
  UString *local_e8;
  Interpreter *local_e0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_d8;
  UString *local_b8;
  Stack *local_b0;
  LocationRange local_a8;
  undefined8 local_68;
  uint uStack_5c;
  UString local_58;
  char32_t *local_38;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = L'\0';
  TVar4 = (this->scratch).t;
  local_110 = loc;
  if ((int)TVar4 < 0x10) {
    if (TVar4 == NULL_TYPE) {
      pcVar18 = L"null";
    }
    else {
      if (TVar4 != BOOLEAN) {
        if (TVar4 != NUMBER) goto LAB_0016d06d;
        jsonnet_unparse_number_abi_cxx11_((string *)local_148,(internal *)this,(this->scratch).v.d);
        decode_utf8((UString *)&local_a8,(string *)local_148);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_append(&local_108,(char32_t *)local_a8.file._M_dataplus._M_p,
                    CONCAT44(local_a8.file._M_string_length._4_4_,
                             (undefined4)local_a8.file._M_string_length));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.file._M_dataplus._M_p != &local_a8.file.field_2) {
          operator_delete(local_a8.file._M_dataplus._M_p,
                          local_a8.file.field_2._M_allocated_capacity * 4 + 4);
        }
        if ((undefined1 *)local_148._0_8_ == local_148 + 0x10) goto LAB_0016d06d;
        puVar17 = (undefined1 *)(local_148._16_8_ + 1);
        _Var19._M_p = (pointer)local_148._0_8_;
        goto LAB_0016cdef;
      }
      pcVar18 = L"false";
      if ((this->scratch).v.b != false) {
        pcVar18 = L"true";
      }
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&local_108,pcVar18);
  }
  else {
    if (3 < TVar4 - ARRAY) goto LAB_0016d06d;
    pVVar1 = &this->scratch;
    uVar15 = (uint)multiline;
    local_e0 = this;
    switch(TVar4) {
    case ARRAY:
      pHVar5 = (this->scratch).v.h;
      if (*(_func_int ***)&pHVar5[1].mark == pHVar5[1]._vptr_HeapEntity) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&local_108,L"[ ]");
        goto LAB_0016d06d;
      }
      pcVar18 = L"[";
      if (multiline) {
        pcVar18 = L"[\n";
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        pcVar6 = (indent->_M_dataplus)._M_p;
        local_e8 = indent;
        local_b8 = __return_storage_ptr__;
        std::__cxx11::u32string::_M_construct<char32_t*>
                  ((u32string *)&local_d8,pcVar6,pcVar6 + indent->_M_string_length);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&local_d8,L"   ");
      }
      else {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        pcVar6 = (indent->_M_dataplus)._M_p;
        local_e8 = indent;
        local_b8 = __return_storage_ptr__;
        std::__cxx11::u32string::_M_construct<char32_t*>
                  ((u32string *)&local_d8,pcVar6,pcVar6 + indent->_M_string_length);
      }
      pp_Var20 = pHVar5[1]._vptr_HeapEntity;
      local_68 = *(_func_int ***)&pHVar5[1].mark;
      if (pp_Var20 != local_68) {
        local_b0 = &this->stack;
        local_38 = L", ";
        uStack_5c = uVar15;
        if (multiline) {
          local_38 = L",\n";
        }
        do {
          pHVar5 = (HeapEntity *)*pp_Var20;
          pLVar16 = (LocationRange *)(*(long *)&pHVar5[6].mark + 8);
          if (*(long *)&pHVar5[6].mark == 0) {
            pLVar16 = local_110;
          }
          paVar3 = &local_a8.file.field_2;
          pcVar7 = (pLVar16->file)._M_dataplus._M_p;
          local_a8.file._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar7,pcVar7 + (pLVar16->file)._M_string_length);
          local_a8.begin.line = (pLVar16->begin).line;
          local_a8.begin.column = (pLVar16->begin).column;
          local_a8.end.line = (pLVar16->end).line;
          local_a8.end.column = (pLVar16->end).column;
          if (pHVar5->field_0xa == '\x01') {
            local_148._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                  *)0x0;
            local_148._8_8_ = 0;
            local_148._16_8_ =
                 (_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)0x0;
            local_148._24_8_ = local_148 + 8;
            local_120 = 0;
            pLVar16 = local_110;
            local_128 = (_Rb_tree_node_base *)local_148._24_8_;
            Stack::newCall(local_b0,local_110,pHVar5,(HeapObject *)0x0,0,(BindingFrame *)local_148);
            std::
            _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)local_148._16_8_,(_Link_type)pLVar16);
            pFVar8 = (local_e0->stack).stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar10 = *(undefined4 *)&pVVar1->field_0x4;
            aVar9 = (this->scratch).v;
            pFVar8[-1].val.t = pVVar1->t;
            *(undefined4 *)&pFVar8[-1].val.field_0x4 = uVar10;
            pFVar8[-1].val.v = aVar9;
            aVar9 = *(anon_union_8_3_4e909c26_for_v *)&pHVar5[1].mark;
            *(_func_int ***)pVVar1 = pHVar5[1]._vptr_HeapEntity;
            (this->scratch).v = aVar9;
            pIVar21 = local_e0;
          }
          else {
            Stack::newCall(local_b0,local_110,pHVar5,*(HeapObject **)&pHVar5[5].mark,
                           *(uint *)&pHVar5[6]._vptr_HeapEntity,(BindingFrame *)&pHVar5[2].mark);
            pIVar21 = local_e0;
            pFVar8 = (local_e0->stack).stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar10 = *(undefined4 *)&pVVar1->field_0x4;
            aVar9 = (this->scratch).v;
            pFVar8[-1].val.t = pVVar1->t;
            *(undefined4 *)&pFVar8[-1].val.field_0x4 = uVar10;
            pFVar8[-1].val.v = aVar9;
            evaluate(local_e0,*(AST **)&pHVar5[6].mark,
                     (int)((ulong)((long)(local_e0->stack).stack.
                                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_e0->stack).stack.
                                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x3d70a3d7);
          }
          manifestJson((UString *)local_148,pIVar21,&local_a8,SUB41(uStack_5c,0),&local_d8);
          pFVar8 = (pIVar21->stack).stack.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar10 = *(undefined4 *)&pFVar8[-1].val.field_0x4;
          aVar9 = pFVar8[-1].val.v;
          pVVar1->t = pFVar8[-1].val.t;
          *(undefined4 *)&pVVar1->field_0x4 = uVar10;
          (this->scratch).v = aVar9;
          if (pFVar8[-1].kind == FRAME_CALL) {
            puVar2 = &(pIVar21->stack).calls;
            *puVar2 = *puVar2 - 1;
          }
          (pIVar21->stack).stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish = pFVar8 + -1;
          Frame::~Frame(pFVar8 + -1);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&local_108,pcVar18);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::_M_append
                    (&local_108,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::_M_append
                    (&local_108,(char32_t *)local_148._0_8_,local_148._8_8_);
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ * 4 + 4);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.file._M_dataplus._M_p != paVar3) {
            operator_delete(local_a8.file._M_dataplus._M_p,
                            local_a8.file.field_2._M_allocated_capacity + 1);
          }
          pp_Var20 = pp_Var20 + 1;
          pcVar18 = local_38;
        } while (pp_Var20 != local_68);
      }
      pcVar18 = L"";
      if (multiline) {
        pcVar18 = L"\n";
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      append(&local_108,pcVar18);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_append(&local_108,(local_e8->_M_dataplus)._M_p,local_e8->_M_string_length);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      append(&local_108,L"]");
      _Var19._M_p = local_d8._M_dataplus._M_p;
      __return_storage_ptr__ = local_b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0016d06d;
      break;
    case FUNCTION:
      __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
      local_a8.file._M_dataplus._M_p = (pointer)&local_a8.file.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"couldn\'t manifest function in JSON output.","");
      Stack::makeError(__return_storage_ptr___00,&local_e0->stack,local_110,&local_a8.file);
      __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    case OBJECT:
      pIVar21 = (Interpreter *)(this->scratch).v.h;
      runInvariants(this,loc,(HeapObject *)pIVar21);
      local_a8.file.field_2._8_8_ = &local_a8.file._M_string_length;
      local_a8.file._M_string_length._0_4_ = 0;
      local_a8.file.field_2._M_allocated_capacity = 0;
      local_a8.begin.column = 0;
      local_e8 = indent;
      local_e0 = pIVar21;
      local_b8 = __return_storage_ptr__;
      local_a8.begin.line = local_a8.file.field_2._8_8_;
      objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    *)local_148,pIVar21,(HeapObject *)0x1,SUB81(local_a8.file.field_2._8_8_,0));
      if ((_Rb_tree_node_base *)local_148._24_8_ != (_Rb_tree_node_base *)(local_148 + 8)) {
        p_Var12 = (_Rb_tree_node_base *)local_148._24_8_;
        do {
          __k = *(key_type **)(p_Var12 + 1);
          ppIVar11 = std::
                     map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                                   *)&local_a8,__k);
          *ppIVar11 = (mapped_type)__k;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        } while (p_Var12 != (_Rb_tree_node_base *)(local_148 + 8));
      }
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)local_148);
      if (local_a8.begin.column == 0) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&local_108,L"{ }");
        __return_storage_ptr__ = local_b8;
      }
      else {
        if (multiline) {
          local_148._0_8_ = local_148 + 0x10;
          pcVar6 = (local_e8->_M_dataplus)._M_p;
          std::__cxx11::u32string::_M_construct<char32_t*>
                    ((u32string *)local_148,pcVar6,pcVar6 + local_e8->_M_string_length);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)local_148,L"   ");
          pcVar18 = L"{\n";
        }
        else {
          local_148._0_8_ = local_148 + 0x10;
          pcVar6 = (local_e8->_M_dataplus)._M_p;
          std::__cxx11::u32string::_M_construct<char32_t*>
                    ((u32string *)local_148,pcVar6,pcVar6 + local_e8->_M_string_length);
          pcVar18 = L"{";
        }
        if ((size_type *)local_a8.file.field_2._8_8_ != &local_a8.file._M_string_length) {
          local_b0 = (Stack *)0x1f9320;
          if (multiline) {
            local_b0 = (Stack *)0x1f9314;
          }
          local_68 = (_func_int **)CONCAT44(local_68._4_4_,uVar15);
          uVar13 = local_a8.file.field_2._8_8_;
          do {
            ast_ = objectIndex(this,local_110,(HeapObject *)local_e0,*(Identifier **)(uVar13 + 0x40)
                               ,0);
            pFVar8 = (this->stack).stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar10 = *(undefined4 *)&pVVar1->field_0x4;
            aVar9 = (this->scratch).v;
            pFVar8[-1].val.t = pVVar1->t;
            *(undefined4 *)&pFVar8[-1].val.field_0x4 = uVar10;
            pFVar8[-1].val.v = aVar9;
            evaluate(this,ast_,
                     (int)((ulong)((long)(this->stack).stack.
                                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->stack).stack.
                                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x3d70a3d7);
            manifestJson(&local_d8,this,&ast_->location,SUB81(local_68,0),(UString *)local_148);
            pFVar8 = (this->stack).stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar10 = *(undefined4 *)&pFVar8[-1].val.field_0x4;
            aVar9 = pFVar8[-1].val.v;
            pVVar1->t = pFVar8[-1].val.t;
            *(undefined4 *)&pVVar1->field_0x4 = uVar10;
            (this->scratch).v = aVar9;
            if (pFVar8[-1].kind == FRAME_CALL) {
              puVar2 = &(this->stack).calls;
              *puVar2 = *puVar2 - 1;
            }
            (this->stack).stack.
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_finish = pFVar8 + -1;
            Frame::~Frame(pFVar8 + -1);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                      (&local_108,pcVar18);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::_M_append
                      (&local_108,(char32_t *)local_148._0_8_,local_148._8_8_);
            jsonnet_string_unparse(&local_58,(UString *)(uVar13 + 0x20),false);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::_M_append
                      (&local_108,local_58._M_dataplus._M_p,local_58._M_string_length);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                      (&local_108,L": ");
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::_M_append
                      (&local_108,local_d8._M_dataplus._M_p,local_d8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              local_58.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              local_d8.field_2._M_allocated_capacity * 4 + 4);
            }
            uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13);
            pcVar18 = (char32_t *)local_b0;
          } while ((size_type *)uVar13 != &local_a8.file._M_string_length);
        }
        pcVar18 = L"";
        if (multiline) {
          pcVar18 = L"\n";
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&local_108,pcVar18);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_append(&local_108,(local_e8->_M_dataplus)._M_p,local_e8->_M_string_length);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&local_108,L"}");
        __return_storage_ptr__ = local_b8;
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ * 4 + 4);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                   *)&local_a8);
      goto LAB_0016d06d;
    case STRING:
      jsonnet_string_unparse((UString *)&local_a8,(UString *)((this->scratch).v.h + 1),false);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_append(&local_108,(char32_t *)local_a8.file._M_dataplus._M_p,
                CONCAT44(local_a8.file._M_string_length._4_4_,
                         (undefined4)local_a8.file._M_string_length));
      local_d8.field_2._M_allocated_capacity = local_a8.file.field_2._M_allocated_capacity;
      _Var19._M_p = (pointer)local_a8.file._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.file._M_dataplus._M_p == &local_a8.file.field_2) goto LAB_0016d06d;
    }
    puVar17 = (undefined1 *)(local_d8.field_2._M_allocated_capacity * 4 + 4);
LAB_0016cdef:
    operator_delete(_Var19._M_p,(ulong)puVar17);
  }
LAB_0016d06d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)__return_storage_ptr__,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  pUVar14 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT44(local_108.field_2._M_local_buf[1],local_108.field_2._M_local_buf[0]) *
                    4 + 4);
    pUVar14 = extraout_RAX_00;
  }
  return pUVar14;
}

Assistant:

UString manifestJson(const LocationRange &loc, bool multiline, const UString &indent)
    {
        // Printing fields means evaluating and binding them, which can trigger
        // garbage collection.

        UStringStream ss;
        switch (scratch.t) {
            case Value::ARRAY: {
                HeapArray *arr = static_cast<HeapArray *>(scratch.v.h);
                if (arr->elements.size() == 0) {
                    ss << U"[ ]";
                } else {
                    const char32_t *prefix = multiline ? U"[\n" : U"[";
                    UString indent2 = multiline ? indent + U"   " : indent;
                    for (auto *thunk : arr->elements) {
                        LocationRange tloc = thunk->body == nullptr ? loc : thunk->body->location;
                        if (thunk->filled) {
                            stack.newCall(loc, thunk, nullptr, 0, BindingFrame{});
                            // Keep arr alive when scratch is overwritten
                            stack.top().val = scratch;
                            scratch = thunk->content;
                        } else {
                            stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
                            // Keep arr alive when scratch is overwritten
                            stack.top().val = scratch;
                            evaluate(thunk->body, stack.size());
                        }
                        auto element = manifestJson(tloc, multiline, indent2);
                        // Restore scratch
                        scratch = stack.top().val;
                        stack.pop();
                        ss << prefix << indent2 << element;
                        prefix = multiline ? U",\n" : U", ";
                    }
                    ss << (multiline ? U"\n" : U"") << indent << U"]";
                }
            } break;

            case Value::BOOLEAN: ss << (scratch.v.b ? U"true" : U"false"); break;

            case Value::NUMBER: ss << decode_utf8(jsonnet_unparse_number(scratch.v.d)); break;

            case Value::FUNCTION:
                throw makeError(loc, "couldn't manifest function in JSON output.");

            case Value::NULL_TYPE: ss << U"null"; break;

            case Value::OBJECT: {
                auto *obj = static_cast<HeapObject *>(scratch.v.h);
                runInvariants(loc, obj);
                // Using std::map has the useful side-effect of ordering the fields
                // alphabetically.
                std::map<UString, const Identifier *> fields;
                for (const auto &f : objectFields(obj, true)) {
                    fields[f->name] = f;
                }
                if (fields.size() == 0) {
                    ss << U"{ }";
                } else {
                    UString indent2 = multiline ? indent + U"   " : indent;
                    const char32_t *prefix = multiline ? U"{\n" : U"{";
                    for (const auto &f : fields) {
                        // pushes FRAME_CALL
                        const AST *body = objectIndex(loc, obj, f.second, 0);
                        stack.top().val = scratch;
                        evaluate(body, stack.size());
                        auto vstr = manifestJson(body->location, multiline, indent2);
                        // Reset scratch so that the object we're manifesting doesn't
                        // get GC'd.
                        scratch = stack.top().val;
                        stack.pop();
                        ss << prefix << indent2 << jsonnet_string_unparse(f.first, false) << U": "
                           << vstr;
                        prefix = multiline ? U",\n" : U", ";
                    }
                    ss << (multiline ? U"\n" : U"") << indent << U"}";
                }
            } break;

            case Value::STRING: {
                const UString &str = static_cast<HeapString *>(scratch.v.h)->value;
                ss << jsonnet_string_unparse(str, false);
            } break;
        }
        return ss.str();
    }